

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O2

void lts2::SoftThresholding(Mat *src,Mat *thresholdedCoeffs,float threshold)

{
  float fVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  undefined8 local_368;
  Scalar_<double> local_360;
  Mat tmp;
  long local_330;
  long *local_2f8;
  Mat local_2e0 [352];
  long *local_180 [44];
  
  cv::Mat::Mat(&tmp);
  cv::abs(local_2e0);
  cv::Scalar_<double>::Scalar_(&local_360,(double)threshold);
  cv::operator-((MatExpr *)local_180,(Scalar_ *)local_2e0);
  (**(code **)(*local_180[0] + 0x18))(local_180[0],local_180,&tmp,0xffffffffffffffff);
  cv::MatExpr::~MatExpr((MatExpr *)local_180);
  cv::MatExpr::~MatExpr((MatExpr *)local_2e0);
  local_368 = CONCAT44((int)**(undefined8 **)(src + 0x40),
                       (int)((ulong)**(undefined8 **)(src + 0x40) >> 0x20));
  cv::Mat::create(thresholdedCoeffs,&local_368,5);
  lVar2 = *(long *)(src + 0x10);
  plVar3 = *(long **)(src + 0x48);
  lVar4 = *(long *)(thresholdedCoeffs + 0x10);
  plVar5 = *(long **)(thresholdedCoeffs + 0x48);
  uVar11 = 0;
  iVar10 = *(int *)(src + 0xc);
  if (*(int *)(src + 0xc) < 1) {
    iVar10 = 0;
  }
  uVar9 = (ulong)*(uint *)(src + 8);
  if ((int)*(uint *)(src + 8) < 1) {
    uVar9 = uVar11;
  }
  for (; uVar11 != uVar9; uVar11 = uVar11 + 1) {
    lVar6 = *plVar5;
    lVar7 = *plVar3;
    lVar8 = *local_2f8;
    for (lVar12 = 0; iVar10 != (int)lVar12; lVar12 = lVar12 + 1) {
      fVar1 = *(float *)(lVar8 * uVar11 + local_330 + lVar12 * 4);
      uVar13 = 0;
      if (0.0 < fVar1) {
        uVar13 = -(uint)(0.0 < *(float *)(lVar7 * uVar11 + lVar2 + lVar12 * 4));
        uVar13 = ~uVar13 & (uint)-fVar1 | uVar13 & (uint)fVar1;
      }
      *(uint *)(lVar6 * uVar11 + lVar4 + lVar12 * 4) = uVar13;
    }
  }
  cv::Mat::~Mat(&tmp);
  return;
}

Assistant:

void lts2::SoftThresholding(const cv::Mat &src, cv::Mat &thresholdedCoeffs, float threshold)
{
  cv::Mat tmp;
  tmp = cv::abs(src) - threshold;
    
  thresholdedCoeffs.create(src.size(), CV_32F);
    
  for (int y = 0; y < src.rows; ++y)
  {
    const float *p_src = src.ptr<float>(y);
    const float *p_tsrc = tmp.ptr<float>(y);
    float *p_th = thresholdedCoeffs.ptr<float>(y);
        
    for (int x = 0; x < src.cols; ++x, ++p_tsrc, ++p_src)
    {
      if (*p_tsrc <= 0.0f)
        *p_th++ = 0.0f;
      else
      {
        float sign = (*p_src > 0.0f) ? 1.0f: -1.0f;
        *p_th++ = sign * *p_tsrc;
      }
    }
  }
}